

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,size_t _elemsize,int _elempack,Allocator *_allocator)

{
  void *pvVar1;
  ulong uVar2;
  
  if ((((this->dims != 1) || (this->w != _w)) || (this->elemsize != _elemsize)) ||
     ((this->elempack != _elempack || (this->allocator != _allocator)))) {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = _elempack;
    this->allocator = _allocator;
    this->dims = 1;
    this->w = _w;
    this->h = 1;
    this->c = 1;
    this->cstep = (long)_w;
    if (_w != 0) {
      uVar2 = (long)_w * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar1 = ncnn::fastMalloc(uVar2 + 4);
      }
      else {
        pvVar1 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator);
      }
      this->data = pvVar1;
      this->refcount = (int *)((long)pvVar1 + uVar2);
      *(undefined4 *)((long)pvVar1 + uVar2) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 1 && w == _w && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 1;
    w = _w;
    h = 1;
    c = 1;

    cstep = w;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}